

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall spvtools::opt::MergeReturnPass::AddNewPhiNodes(MergeReturnPass *this)

{
  Function *func;
  bool bVar1;
  CFG *this_00;
  reference root;
  reference ppBVar2;
  BasicBlock *bb;
  iterator __end2;
  iterator __begin2;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *__range2;
  undefined1 local_28 [8];
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> order;
  MergeReturnPass *this_local;
  
  order.super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl._M_node._M_size = (size_t)this;
  std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
  list((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)local_28);
  this_00 = Pass::cfg((Pass *)this);
  func = this->function_;
  ___range2 = opt::Function::begin(this->function_);
  root = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                   ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__range2);
  CFG::ComputeStructuredOrder
            (this_00,func,root,
             (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
             local_28);
  __end2 = std::__cxx11::
           list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::begin
                     ((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       *)local_28);
  bb = (BasicBlock *)
       std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
       ::end((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
             local_28);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&bb);
    if (!bVar1) break;
    ppBVar2 = std::_List_iterator<spvtools::opt::BasicBlock_*>::operator*(&__end2);
    AddNewPhiNodes(this,*ppBVar2);
    std::_List_iterator<spvtools::opt::BasicBlock_*>::operator++(&__end2);
  }
  std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
  ~list((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)local_28)
  ;
  return;
}

Assistant:

void MergeReturnPass::AddNewPhiNodes() {
  std::list<BasicBlock*> order;
  cfg()->ComputeStructuredOrder(function_, &*function_->begin(), &order);

  for (BasicBlock* bb : order) {
    AddNewPhiNodes(bb);
  }
}